

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O0

void __thiscall Neuron_testTeachNegative_Test::TestBody(Neuron_testTeachNegative_Test *this)

{
  bool bVar1;
  Connections *pCVar2;
  const_reference pvVar3;
  ostream *poVar4;
  char *pcVar5;
  char *in_R9;
  float fVar6;
  AssertHelper local_3f8;
  Message local_3f0;
  int local_3e4;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_370;
  Message local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_330;
  Message local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_;
  int local_308;
  float mem;
  int t;
  int spiked;
  ofstream fn;
  float local_100;
  float w;
  undefined1 local_f0 [8];
  Neuron n2;
  Neuron n1;
  Neuron_testTeachNegative_Test *this_local;
  
  Neuron::Neuron((Neuron *)
                 &n2.m_watchFor.
                  super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,10.0,1.0,50.0);
  Neuron::Neuron((Neuron *)local_f0,30.0,1.0,50.0);
  Neuron::connectTo((Neuron *)
                    &n2.m_watchFor.
                     super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(Neuron *)local_f0,-50.0);
  pCVar2 = Neuron::connections((Neuron *)
                               &n2.m_watchFor.
                                super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar3 = std::vector<Connection,_std::allocator<Connection>_>::operator[](pCVar2,0);
  local_100 = Connection::weight(pvVar3);
  std::ofstream::ofstream(&t);
  std::ofstream::open(&t,"testTeachNegative.csv",0x10);
  Neuron::spike((Neuron *)
                &n2.m_watchFor.
                 super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Neuron::apply((Neuron *)local_f0,50.0,(Connection *)0x0);
  mem = 0.0;
  for (local_308 = 0; local_308 < 600; local_308 = local_308 + 1) {
    gtest_ar_.message_.ptr_._4_4_ = Neuron::mem((Neuron *)local_f0);
    poVar4 = (ostream *)std::ostream::operator<<(&t,local_308);
    poVar4 = std::operator<<(poVar4,"; ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,gtest_ar_.message_.ptr_._4_4_);
    poVar4 = std::operator<<(poVar4,"; ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    Neuron::tick((Neuron *)
                 &n2.m_watchFor.
                  super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,1.0);
    bVar1 = Neuron::tick((Neuron *)local_f0,1.0);
    if (bVar1) {
      pCVar2 = Neuron::connections((Neuron *)
                                   &n2.m_watchFor.
                                    super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar3 = std::vector<Connection,_std::allocator<Connection>_>::operator[](pCVar2,0);
      fVar6 = Connection::weight(pvVar3);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_320,fVar6 < local_100);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
      if (!bVar1) {
        testing::Message::Message(&local_328);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__1.message_,(internal *)local_320,
                   (AssertionResult *)"n1.connections()[0].weight() < w","false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_330,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0xb0,pcVar5);
        testing::internal::AssertHelper::operator=(&local_330,&local_328);
        testing::internal::AssertHelper::~AssertHelper(&local_330);
        std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_328);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
      pCVar2 = Neuron::connections((Neuron *)
                                   &n2.m_watchFor.
                                    super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar3 = std::vector<Connection,_std::allocator<Connection>_>::operator[](pCVar2,0);
      local_100 = Connection::weight(pvVar3);
      mem = (float)((int)mem + 1);
    }
    if (local_308 == 0xb4) {
      bVar1 = Neuron::apply((Neuron *)local_f0,50.0,(Connection *)0x0);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_360,bVar1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
      if (!bVar1) {
        testing::Message::Message(&local_368);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_360,
                   (AssertionResult *)"n2.apply(50)","false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_370,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0xb6,pcVar5);
        testing::internal::AssertHelper::operator=(&local_370,&local_368);
        testing::internal::AssertHelper::~AssertHelper(&local_370);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_368);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
    }
    if (local_308 == 200) {
      Neuron::spike((Neuron *)
                    &n2.m_watchFor.
                     super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (local_308 == 0x140) {
      bVar1 = Neuron::apply((Neuron *)local_f0,50.0,(Connection *)0x0);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_3a0,bVar1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
      if (!bVar1) {
        testing::Message::Message(&local_3a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_3a0,
                   (AssertionResult *)"n2.apply(50)","false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0xbc,pcVar5);
        testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
        testing::internal::AssertHelper::~AssertHelper(&local_3b0);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_3a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
    }
    if (local_308 == 0x14a) {
      Neuron::spike((Neuron *)
                    &n2.m_watchFor.
                     super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  local_3e4 = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_3e0,"2","spiked",&local_3e4,(int *)&mem);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0xc2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  std::ofstream::~ofstream(&t);
  Neuron::~Neuron((Neuron *)local_f0);
  Neuron::~Neuron((Neuron *)
                  &n2.m_watchFor.
                   super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Neuron, testTeachNegative)
{
    Neuron n1;
    Neuron n2(30);
    n1.connectTo(&n2, -50.0f);
    float w = n1.connections()[0].weight();
    std::ofstream fn;
    fn.open("testTeachNegative.csv");

    n1.spike();
    n2.apply(50);
    int spiked = 0;
    for (int t = 0; t < 600; ++t) {
        float mem = n2.mem();
        fn << t << "; " << mem << "; " << std::endl;
        n1.tick(TIME_STEP);
        if (n2.tick(TIME_STEP)) {
            EXPECT_TRUE(n1.connections()[0].weight() < w);
            w = n1.connections()[0].weight();
            ++spiked;
        }

        if (t == 180)
            EXPECT_TRUE(n2.apply(50));

        if (t == 200)
            n1.spike();

        if (t == 320)
            EXPECT_TRUE(n2.apply(50));

        if (t == 330)
            n1.spike();

    }
    EXPECT_EQ(2, spiked);
}